

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O2

QSize __thiscall QIcon::actualSize(QIcon *this,QWindow *window,QSize *size,Mode mode,State state)

{
  QIconEngine *pQVar1;
  Representation extraout_var;
  QSize QVar2;
  Representation extraout_var_00;
  ulong uVar3;
  long in_FS_OFFSET;
  qreal qVar4;
  QSize local_40;
  QSize local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xffffffff00000000;
  if (this->d == (QIconPrivate *)0x0) {
    QVar2.wd.m_i = -1;
    QVar2.ht.m_i = 0;
  }
  else {
    if (window == (QWindow *)0x0) {
      qVar4 = QGuiApplication::devicePixelRatio(QCoreApplication::self);
    }
    else {
      qVar4 = QWindow::devicePixelRatio(window);
    }
    if (qVar4 <= 1.0) {
      pQVar1 = this->d->engine;
      QVar2.wd.m_i = (*pQVar1->_vptr_QIconEngine[3])(pQVar1,size,(ulong)mode,(ulong)state);
      QVar2.ht.m_i = extraout_var_00.m_i;
    }
    else {
      pQVar1 = this->d->engine;
      local_40 = operator*(size,qVar4);
      local_38.wd.m_i = (*pQVar1->_vptr_QIconEngine[3])(pQVar1,&local_40,(ulong)mode,(ulong)state);
      local_38.ht.m_i = extraout_var.m_i;
      qVar4 = QIconPrivate::pixmapDevicePixelRatio(qVar4,size,&local_38);
      QVar2 = operator/(&local_38,qVar4);
    }
    uVar3 = (ulong)QVar2 & 0xffffffff00000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSize)((ulong)QVar2 & 0xffffffff | uVar3);
  }
  __stack_chk_fail();
}

Assistant:

QSize QIcon::actualSize(QWindow *window, const QSize &size, Mode mode, State state) const
{
    if (!d)
        return QSize();

    qreal devicePixelRatio = window ? window->devicePixelRatio() : qApp->devicePixelRatio();

    // Handle the simple normal-dpi case:
    if (!(devicePixelRatio > 1.0))
        return d->engine->actualSize(size, mode, state);

    QSize actualSize = d->engine->actualSize(size * devicePixelRatio, mode, state);
    return actualSize / d->pixmapDevicePixelRatio(devicePixelRatio, size, actualSize);
}